

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O1

zlib_table * zlib_mktable(uchar *lengths,int nlengths)

{
  byte bVar1;
  zlib_table *pzVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int count [16];
  int startcode [16];
  int codes [288];
  uint auStack_508 [17];
  uint local_4c4 [15];
  int local_488 [290];
  
  auStack_508[1] = 0;
  auStack_508[2] = 0;
  auStack_508[3] = 0;
  auStack_508[4] = 0;
  auStack_508[5] = 0;
  auStack_508[6] = 0;
  auStack_508[7] = 0;
  auStack_508[8] = 0;
  auStack_508[9] = 0;
  auStack_508[10] = 0;
  auStack_508[0xb] = 0;
  auStack_508[0xc] = 0;
  auStack_508[0xd] = 0;
  auStack_508[0xe] = 0;
  auStack_508[0xf] = 0;
  uVar8 = 0;
  uVar7 = 0;
  if (0 < nlengths) {
    uVar4 = 0;
    uVar7 = 0;
    do {
      bVar1 = lengths[uVar4];
      auStack_508[bVar1] = auStack_508[bVar1] + 1;
      uVar3 = (uint)bVar1;
      if (bVar1 < uVar7) {
        uVar3 = uVar7;
      }
      uVar7 = uVar3;
      uVar4 = uVar4 + 1;
    } while ((uint)nlengths != uVar4);
  }
  lVar5 = 1;
  do {
    auStack_508[lVar5 + 0x10] = uVar8;
    uVar8 = (uVar8 + auStack_508[lVar5]) * 2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  if (0 < nlengths) {
    uVar4 = 0;
    do {
      bVar1 = lengths[uVar4];
      uVar6 = (ulong)bVar1;
      uVar8 = auStack_508[uVar6 + 0x10];
      auStack_508[uVar6 + 0x10] = uVar8 + 1;
      local_488[uVar4] = 0;
      if (bVar1 != 0) {
        iVar9 = local_488[uVar4];
        do {
          iVar9 = (uVar8 & 1) + iVar9 * 2;
          uVar8 = (int)uVar8 >> 1;
          uVar3 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar3;
        } while (uVar3 != 0);
        local_488[uVar4] = iVar9;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nlengths);
  }
  uVar8 = 9;
  if (uVar7 < 9) {
    uVar8 = uVar7;
  }
  pzVar2 = zlib_mkonetab(local_488,lengths,nlengths,0,0,uVar8);
  return pzVar2;
}

Assistant:

static struct zlib_table *zlib_mktable(unsigned char *lengths,
                                       int nlengths)
{
    int count[MAXCODELEN], startcode[MAXCODELEN], codes[MAXSYMS];
    int code, maxlen;
    int i, j;

    /* Count the codes of each length. */
    maxlen = 0;
    for (i = 1; i < MAXCODELEN; i++)
        count[i] = 0;
    for (i = 0; i < nlengths; i++) {
        count[lengths[i]]++;
        if (maxlen < lengths[i])
            maxlen = lengths[i];
    }
    /* Determine the starting code for each length block. */
    code = 0;
    for (i = 1; i < MAXCODELEN; i++) {
        startcode[i] = code;
        code += count[i];
        code <<= 1;
    }
    /* Determine the code for each symbol. Mirrored, of course. */
    for (i = 0; i < nlengths; i++) {
        code = startcode[lengths[i]]++;
        codes[i] = 0;
        for (j = 0; j < lengths[i]; j++) {
            codes[i] = (codes[i] << 1) | (code & 1);
            code >>= 1;
        }
    }

    /*
     * Now we have the complete list of Huffman codes. Build a
     * table.
     */
    return zlib_mkonetab(codes, lengths, nlengths, 0, 0,
                         maxlen < 9 ? maxlen : 9);
}